

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-digits.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  FILE *pFVar3;
  char *pcVar4;
  long lVar5;
  float fVar6;
  double dVar7;
  size_t sStack_50;
  char *local_40;
  FILE *local_38;
  
  name = *argv;
  fVar6 = 0.0;
  pFVar3 = _stdout;
LAB_00101239:
  do {
    iVar1 = __posix_getopt(argc,argv,"d:o:");
    if (iVar1 == -1) {
      local_40 = (char *)CONCAT44(local_40._4_4_,fVar6);
      local_38 = pFVar3;
      if (pFVar3 != (FILE *)0x0) {
        lVar5 = (long)_optind;
        if (_optind == argc) {
          handle_file(_stdin,(Settings *)&local_40);
        }
        for (; lVar5 < argc; lVar5 = lVar5 + 1) {
          pFVar3 = fopen(argv[lVar5],"r");
          if (pFVar3 == (FILE *)0x0) {
            fprintf(_stderr,"%s ERROR:\t",name);
            fprintf(_stderr,"couldn\'t open file %s",argv[lVar5]);
            fputc(10,_stderr);
          }
          else {
            handle_file((FILE *)pFVar3,(Settings *)&local_40);
            fclose(pFVar3);
          }
        }
        exit(0);
      }
      fprintf(_stderr,"%s ERROR:\t",name);
      pcVar4 = "couldn\'t open output file";
      sStack_50 = 0x19;
LAB_00101400:
      fwrite(pcVar4,sStack_50,1,_stderr);
      fputc(10,_stderr);
LAB_00101414:
      exit(1);
    }
    local_40 = (char *)0x0;
    if (iVar1 != 0x6f) {
      if (iVar1 != 100) {
        fprintf(_stdout,"USAGE: %s [-d DELAY] [-o OUTPUTFILE] [FILE]...\n",name);
        goto LAB_00101414;
      }
      dVar7 = strtod(_optarg,&local_40);
      pcVar4 = _optarg;
      sVar2 = strlen(_optarg);
      if (pcVar4 + sVar2 != local_40) {
        fprintf(_stderr,"%s ERROR:\t",name);
        pcVar4 = "d value is not a valid double";
        sStack_50 = 0x1d;
        goto LAB_00101400;
      }
      fVar6 = (float)dVar7;
      goto LAB_00101239;
    }
    if (pFVar3 != _stdout) {
      fclose(pFVar3);
    }
    pFVar3 = fopen(_optarg,"w");
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    name = argv[0];

    Settings set = {0, stdout};
    int i = handle_arguments(argc, argv, &set);

    if (i == argc)
    {
        handle_file(stdin, &set);
    }
    for (; i < argc; i++)
    {
        FILE *input = fopen(argv[i], "r");
        if (input == NULL)
        {
            ERROR_MSG("couldn't open file %s", argv[i]);
            continue;
        }
        handle_file(input, &set);
        fclose(input);
    }

    exit(EXIT_SUCCESS);
}